

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O2

void discrete_dist_test_chi2_test<trng::uniform_int_dist>(uniform_int_dist *d)

{
  double *pdVar1;
  result_type_conflict4 x;
  result_type_conflict4 rVar2;
  int iVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var4;
  int iVar5;
  int iVar6;
  double *__src;
  pointer __src_00;
  long lVar7;
  int iVar8;
  bool bVar9;
  double dVar10;
  parameter_type P;
  vector<double,_std::allocator<double>_> p;
  vector<int,_std::allocator<int>_> count;
  AssertionHandler catchAssertionHandler;
  StringRef local_70;
  lcg64_shift R;
  StringRef local_48;
  SourceLineInfo local_38;
  
  p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  rVar2 = (d->P).a_;
  do {
    x = rVar2;
    iVar6 = (d->P).b_;
    if (iVar6 <= x) goto LAB_0020e592;
    catchAssertionHandler.m_assertionInfo.macroName.m_start =
         (char *)trng::uniform_int_dist::pdf(d,x);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&p,(double *)&catchAssertionHandler);
    dVar10 = trng::uniform_int_dist::cdf(d,x);
    rVar2 = x + 1;
  } while (dVar10 <= 0.99);
  iVar6 = (d->P).b_;
LAB_0020e592:
  if (x < iVar6 + -1) {
    dVar10 = trng::uniform_int_dist::cdf(d,x);
    catchAssertionHandler.m_assertionInfo.macroName.m_start = (char *)(1.0 - dVar10);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&p,(double *)&catchAssertionHandler);
  }
  iVar8 = (int)((ulong)((long)p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3);
  catchAssertionHandler.m_assertionInfo.macroName.m_start =
       (char *)((ulong)catchAssertionHandler.m_assertionInfo.macroName.m_start & 0xffffffff00000000)
  ;
  std::vector<int,_std::allocator<int>_>::vector
            (&count,(long)iVar8,(value_type_conflict *)&catchAssertionHandler,(allocator_type *)&R);
  P.b = 1;
  P.a = 0xfbd19fbbc5c07ff5;
  trng::lcg64_shift::lcg64_shift(&R,100,P);
  iVar8 = iVar8 + -1;
  iVar6 = 10000;
  while (bVar9 = iVar6 != 0, iVar6 = iVar6 + -1, bVar9) {
    rVar2 = trng::uniform_int_dist::operator()(d,&R);
    iVar3 = rVar2 - (d->P).a_;
    iVar5 = iVar8;
    if (iVar3 <= iVar8) {
      iVar5 = iVar3;
    }
    count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [iVar5] = count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[iVar5] + 1;
  }
  while ((0x10 < (ulong)((long)p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start) &&
         (_Var4 = std::
                  __min_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                            (count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start,
                             count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish), *_Var4._M_current < 9))) {
    lVar7 = (long)_Var4._M_current -
            (long)count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
    pdVar1 = (double *)
             ((long)p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar7 * 2);
    __src = pdVar1 + 1;
    dVar10 = *pdVar1;
    iVar6 = *_Var4._M_current;
    if (__src != p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish) {
      memmove((void *)((long)p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar7 * 2),__src,
              (long)p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)__src);
    }
    p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
         = p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish + -1;
    __src_00 = (pointer)((long)count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar7 + 4);
    if (__src_00 !=
        count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      memmove((void *)((long)count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar7),__src_00,
              (long)count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)__src_00);
    }
    count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish + -1;
    _Var4 = std::
            __min_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    *(double *)
     ((long)p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start +
     ((long)_Var4._M_current -
     (long)count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start) * 2) =
         dVar10 + *(double *)
                   ((long)p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start +
                   ((long)_Var4._M_current -
                   (long)count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start) * 2);
    *_Var4._M_current = *_Var4._M_current + iVar6;
  }
  dVar10 = chi_percentil(&p,&count);
  local_70.m_start = "REQUIRE";
  local_70.m_size = 7;
  local_38.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_38.line = 0x11c;
  Catch::StringRef::StringRef(&local_48,"(0.01 < c2_p and c2_p < 0.99)");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,&local_70,&local_38,local_48,Normal);
  local_70.m_start =
       (char *)(CONCAT71(local_70.m_start._1_7_,-(dVar10 < 0.99) & -(0.01 < dVar10)) &
               0xffffffffffffff01);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_70);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&count.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&p.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void discrete_dist_test_chi2_test(dist &d) {
  using result_type = typename dist::result_type;
  std::vector<double> p;
  {
    int i{d.min()};
    while (i <= d.max()) {
      p.push_back(d.pdf(i));
      double P{d.cdf(i)};
      if (P > 0.99)
        break;
      ++i;
    }
    if (i < d.max())
      p.push_back(1.0 - d.cdf(i));
  }
  const int bins{static_cast<int>(p.size())};
  const int N{10000};
  std::vector<int> count(bins, 0);
  trng::lcg64_shift R(100ull);
  for (int i{0}; i < N; ++i) {
    const result_type x{d(R) - d.min()};
    int bin{std::min(x, bins - 1)};
    ++count[bin];
  }
  // merge bins with very small count numbers
  while (p.size() > 2) {
    auto min{std::min_element(count.begin(), count.end())};
    if (*min > 8)
      break;
    auto pos{min - count.begin()};
    const double p_old{p[pos]};
    const int count_old{count[pos]};
    p.erase(p.begin() + pos);
    count.erase(count.begin() + pos);
    min = std::min_element(count.begin(), count.end());
    pos = min - count.begin();
    p[pos] += p_old;
    count[pos] += count_old;
  }
  const double c2_p{chi_percentil(p, count)};
  REQUIRE((0.01 < c2_p and c2_p < 0.99));
}